

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetSP.c
# Opt level: O1

DdNode * Cudd_SubsetShortPaths(DdManager *dd,DdNode *f,int numVars,int threshold,int hardlimit)

{
  DdNode *pDVar1;
  
  memOut = 0;
  do {
    dd->reordered = 0;
    pDVar1 = cuddSubsetShortPaths(dd,f,numVars,threshold,hardlimit);
    if (dd->reordered != 1) {
      return pDVar1;
    }
  } while ((memOut & 1) == 0);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_SubsetShortPaths(
  DdManager * dd /* manager */,
  DdNode * f /* function to be subset */,
  int  numVars /* number of variables in the support of f */,
  int  threshold /* maximum number of nodes in the subset */,
  int  hardlimit /* flag: 1 if threshold is a hard limit */)
{
    DdNode *subset;

    memOut = 0;
    do {
        dd->reordered = 0;
        subset = cuddSubsetShortPaths(dd, f, numVars, threshold, hardlimit);
    } while((dd->reordered ==1) && (!memOut));

    return(subset);

}